

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  string *psVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  size_t sVar4;
  size_t sVar5;
  pointer ppMVar6;
  FileDescriptor *pFVar7;
  pointer ppEVar8;
  undefined1 qualified;
  FileGenerator *pFVar9;
  pointer ppMVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  char *pcVar11;
  unsigned_long i;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar12;
  unsigned_long i_00;
  int iVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  FileGenerator *pFVar17;
  int iVar18;
  size_t offset;
  pointer ppVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  bool bVar23;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairs;
  string local_1b0;
  string local_190;
  int local_16c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  size_t value;
  InternalMetadataWithArena IStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [12];
  string local_50;
  
  io::Printer::Print(printer,
                     "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n    const TableStruct::entries[] = {\n"
                    );
  io::Printer::Indent(printer);
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppMVar6) {
    bVar23 = true;
  }
  else {
    uVar20 = 0;
    lVar16 = 0;
    do {
      sVar4 = MessageGenerator::GenerateParseOffsets(ppMVar6[uVar20],printer);
      value = sVar4;
      if (entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&entries,
                   (iterator)
                   entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_finish,&value);
      }
      else {
        *entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = sVar4;
        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar16 = lVar16 + value;
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
    bVar23 = lVar16 == 0;
  }
  if (bVar23) {
    io::Printer::Print(printer,"{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\n\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n    const TableStruct::aux[] = {\n"
                    );
  io::Printer::Indent(printer);
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
    uVar20 = 0;
    lVar16 = 0;
    do {
      sVar4 = MessageGenerator::GenerateParseAuxTable(ppMVar6[uVar20],printer);
      value = sVar4;
      if (aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&aux_entries,
                   (iterator)
                   aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&value);
      }
      else {
        *aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = sVar4;
        aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar16 = lVar16 + value;
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
    if (lVar16 != 0) goto LAB_0024e73d;
  }
  io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
LAB_0024e73d:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n    TableStruct::schema[] = {\n"
                    );
  io::Printer::Indent(printer);
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppMVar10 = (this->message_generators_).
             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar10 != ppMVar6) {
    uVar20 = 0;
    sVar4 = 0;
    offset = 0;
    do {
      MessageGenerator::GenerateParseTable(ppMVar6[uVar20],printer,offset,sVar4);
      offset = offset + entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar20];
      sVar4 = sVar4 + aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20];
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppMVar10 = (this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar20 < (ulong)((long)ppMVar10 - (long)ppMVar6 >> 3));
  }
  if (ppMVar6 == ppMVar10) {
    io::Printer::Print(printer,"{ NULL, NULL, 0, -1, -1, false },\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n\n");
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    if ((this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print(printer,
                         "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\nstatic const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\nstatic const ::google::protobuf::Message* const* file_default_instances = NULL;\n"
                        );
    }
    else {
      io::Printer::Print(printer,"const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      io::Printer::Indent(printer);
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->message_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
        uVar20 = 0;
        do {
          _value = MessageGenerator::GenerateOffsets(ppMVar6[uVar20],printer);
          if (pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&pairs,
                       (iterator)
                       pairs.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pair<unsigned_long,_unsigned_long> *)&value);
          }
          else {
            (pairs.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = value;
            (pairs.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second =
                 (unsigned_long)
                 IStack_120.
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
            pairs.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 pairs.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar20 = uVar20 + 1;
          ppMVar6 = (this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar20 < (ulong)((long)(this->message_generators_).
                                        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6
                                 >> 3));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "};\n\nstatic const ::google::protobuf::internal::MigrationSchema schemas[] = {\n"
                        );
      io::Printer::Indent(printer);
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->message_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
        lVar16 = 0;
        uVar20 = 0;
        iVar13 = 0;
        do {
          MessageGenerator::GenerateSchema
                    (ppMVar6[uVar20],printer,iVar13,
                     *(int *)((long)&(pairs.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second + lVar16));
          iVar13 = iVar13 + *(int *)((long)&(pairs.
                                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first +
                                    lVar16);
          uVar20 = uVar20 + 1;
          ppMVar6 = (this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 0x10;
        } while (uVar20 < (ulong)((long)(this->message_generators_).
                                        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6
                                 >> 3));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "};\n\nstatic ::google::protobuf::Message const * const file_default_instances[] = {\n"
                        );
      io::Printer::Indent(printer);
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->message_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
        pFVar17 = (FileGenerator *)0x0;
        pFVar9 = this;
        do {
          ClassName_abi_cxx11_
                    ((string *)&value,(cpp *)ppMVar6[(long)pFVar17]->descriptor_,(Descriptor *)0x0,
                     SUB81(pFVar9,0));
          io::Printer::Print(printer,
                             "reinterpret_cast<const ::google::protobuf::Message*>(&_$classname$_default_instance_),\n"
                             ,"classname",(string *)&value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value != local_118) {
            operator_delete((void *)value,local_118[0]._M_allocated_capacity + 1);
          }
          pFVar17 = (FileGenerator *)((long)&pFVar17->file_ + 1);
          ppMVar6 = (this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar9 = (FileGenerator *)
                   ((long)(this->message_generators_).
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
        } while (pFVar17 < pFVar9);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      if (pairs.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pairs.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)pairs.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)pairs.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    value = (size_t)local_118;
    pcVar21 = "NULL";
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"NULL","");
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar10 = (this->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar14 = "file_level_metadata";
    if (ppMVar6 == ppMVar10) {
      pcVar14 = "NULL";
    }
    psVar1 = *(string **)this->file_;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&pairs.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar11 = pcVar14 + 0x13;
    if (ppMVar6 == ppMVar10) {
      pcVar11 = pcVar14 + 4;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&pairs,pcVar14,pcVar11);
    ppEVar2 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar14 = "file_level_enum_descriptors";
    if (ppEVar2 == ppEVar3) {
      pcVar14 = "NULL";
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar11 = pcVar14 + 0x1b;
    if (ppEVar2 == ppEVar3) {
      pcVar11 = pcVar14 + 4;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,pcVar14,pcVar11);
    if ((((0 < *(int *)(this->file_ + 0x78)) && ((this->options_).enforce_lite == false)) &&
        (lVar16 = *(long *)(this->file_ + 0xa0), *(int *)(lVar16 + 0xa8) != 3)) &&
       (pcVar21 = "NULL", *(char *)(lVar16 + 0xa3) != '\0')) {
      pcVar21 = "file_level_service_descriptors";
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    sVar5 = strlen(pcVar21);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,pcVar21,pcVar21 + sVar5);
    io::Printer::Print(printer,
                       "namespace {\n\nvoid protobuf_AssignDescriptors() {\n  AddDescriptors();\n  ::google::protobuf::MessageFactory* factory = $factory$;\n  AssignDescriptors(\n      \"$filename$\", schemas, file_default_instances, TableStruct::offsets, factory,\n      $metadata$, $enum_descriptors$, $service_descriptors$);\n"
                       ,"filename",psVar1,"metadata",(string *)&pairs,"enum_descriptors",&local_1b0,
                       "service_descriptors",&local_190,"factory",(string *)&value);
    uVar20 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      uVar20 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      uVar20 = extraout_RDX_01;
    }
    if (pairs.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&pairs.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(pairs.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(pairs.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1
                             ));
      uVar20 = extraout_RDX_02;
    }
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar10 = (this->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar10 != ppMVar6) {
      uVar22 = 0;
      do {
        qualified = SUB81(ppMVar10,0);
        if (*(char *)(*(long *)(ppMVar6[uVar22]->descriptor_ + 0x20) + 0x6b) == '\x01') {
          SimpleItoa_abi_cxx11_((string *)&pairs,(protobuf *)(uVar22 & 0xffffffff),(int)uVar20);
          ClassName_abi_cxx11_
                    (&local_1b0,
                     *(cpp **)((this->message_generators_).
                               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar22]->descriptor_ + 0x18
                              ),(Descriptor *)0x0,(bool)qualified);
          ClassName_abi_cxx11_
                    (&local_190,
                     (cpp *)(this->message_generators_).
                            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->descriptor_,
                     (Descriptor *)0x0,(bool)qualified);
          io::Printer::Print(printer,
                             "file_level_metadata[$index$].reflection = $parent$::$classname$::CreateReflection(file_level_metadata[$index$].descriptor, _$classname$_default_instance_.get_mutable());\n"
                             ,"index",(string *)&pairs,"parent",&local_1b0,"classname",&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if (pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&pairs.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(pairs.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(pairs.
                                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + 1));
          }
        }
        uVar22 = uVar22 + 1;
        ppMVar6 = (this->message_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = (this->message_generators_).
                   super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar20 = (long)ppMVar10 - (long)ppMVar6 >> 3;
      } while (uVar22 < uVar20);
    }
    pcVar21 = "NULL";
    pcVar14 = "file_level_metadata";
    if (ppMVar6 == ppMVar10) {
      pcVar14 = "NULL";
    }
    psVar1 = *(string **)this->file_;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&pairs.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar11 = pcVar14 + 0x13;
    if (ppMVar6 == ppMVar10) {
      pcVar11 = pcVar14 + 4;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&pairs,pcVar14,pcVar11);
    ppEVar2 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (this->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar14 = "file_level_enum_descriptors";
    if (ppEVar2 == ppEVar3) {
      pcVar14 = "NULL";
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar11 = pcVar14 + 0x1b;
    if (ppEVar2 == ppEVar3) {
      pcVar11 = pcVar14 + 4;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,pcVar14,pcVar11);
    if (((0 < *(int *)(this->file_ + 0x78)) && ((this->options_).enforce_lite == false)) &&
       ((lVar16 = *(long *)(this->file_ + 0xa0), *(int *)(lVar16 + 0xa8) != 3 &&
        (pcVar21 = "NULL", *(char *)(lVar16 + 0xa3) != '\0')))) {
      pcVar21 = "file_level_service_descriptors";
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    sVar5 = strlen(pcVar21);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,pcVar21,pcVar21 + sVar5);
    io::Printer::Print(printer,
                       "}\n\nvoid protobuf_AssignDescriptorsOnce() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n}\n\n"
                       ,"filename",psVar1,"metadata",(string *)&pairs,"enum_descriptors",&local_1b0,
                       "service_descriptors",&local_190,"factory",(string *)&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (pairs.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&pairs.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(pairs.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(pairs.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1
                             ));
    }
    io::Printer::Print(printer,
                       "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\nvoid protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent(printer);
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar10 = (this->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar6 != ppMVar10) {
      SimpleItoa_abi_cxx11_((string *)&pairs,(protobuf *)((long)ppMVar10 - (long)ppMVar6 >> 3),i);
      io::Printer::Print(printer,
                         "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n"
                         ,"size",(string *)&pairs);
      if (pairs.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&pairs.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(pairs.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(pairs.
                                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                               1));
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n}  // namespace\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value != local_118) {
      operator_delete((void *)value,local_118[0]._M_allocated_capacity + 1);
    }
  }
  io::Printer::Print(printer,"\nvoid TableStruct::Shutdown() {\n");
  io::Printer::Indent(printer);
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = extraout_RDX_03;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
    uVar20 = 0;
    do {
      MessageGenerator::GenerateShutdownCode(ppMVar6[uVar20],printer);
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = extraout_RDX_04;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
  }
  if ((((this->options_).enforce_lite == false) &&
      (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) &&
     (ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->message_generators_).
     super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
     ._M_impl.super__Vector_impl_data._M_finish != ppMVar6)) {
    uVar20 = 0;
    do {
      if (*(char *)(*(long *)(ppMVar6[uVar20]->descriptor_ + 0x20) + 0x6b) == '\x01') {
        SimpleItoa_abi_cxx11_((string *)&value,(protobuf *)(uVar20 & 0xffffffff),(int)uVar12);
        io::Printer::Print(printer,"delete file_level_metadata[$index$].reflection;\n","index",
                           (string *)&value);
        uVar12 = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value != local_118) {
          operator_delete((void *)value,local_118[0]._M_allocated_capacity + 1);
          uVar12 = extraout_RDX_06;
        }
      }
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "void TableStruct::InitDefaultsImpl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n  ::google::protobuf::internal::InitProtobufDefaults();\n"
                    );
  io::Printer::Indent(printer);
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x18)) {
    iVar13 = 0;
    do {
      pFVar7 = FileDescriptor::dependency(pFVar7,iVar13);
      psVar1 = *(string **)(pFVar7 + 8);
      FileLevelNamespace((string *)&pairs,*(string **)pFVar7);
      QualifiedFileLevelSymbol((string *)&value,psVar1,(string *)&pairs);
      if (pairs.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&pairs.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(pairs.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(pairs.
                                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                               1));
      }
      io::Printer::Print(printer,"$file_namespace$::InitDefaults();\n","file_namespace",
                         (string *)&value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value != local_118) {
        operator_delete((void *)value,local_118[0]._M_allocated_capacity + 1);
      }
      iVar13 = iVar13 + 1;
      pFVar7 = this->file_;
    } while (iVar13 < *(int *)(pFVar7 + 0x18));
  }
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
    uVar20 = 0;
    do {
      MessageGenerator::GenerateDefaultInstanceAllocator(ppMVar6[uVar20],printer);
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
  }
  ppEVar8 = (this->extension_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extension_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar8) {
    uVar20 = 0;
    do {
      ExtensionGenerator::GenerateRegistration(ppEVar8[uVar20],printer);
      uVar20 = uVar20 + 1;
      ppEVar8 = (this->extension_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->extension_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8 >> 3)
            );
  }
  ppMVar6 = (this->message_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar6) {
    uVar20 = 0;
    do {
      MessageGenerator::GenerateDefaultInstanceInitializer(ppMVar6[uVar20],printer);
      uVar20 = uVar20 + 1;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3)
            );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\nvoid InitDefaults() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n}\n"
                    );
  io::Printer::Print(printer,"void AddDescriptorsImpl() {\n  InitDefaults();\n");
  io::Printer::Indent(printer);
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&value);
    FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)&value);
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&pairs.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)pairs.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    MessageLite::SerializeToString((MessageLite *)&value,(string *)&pairs);
    io::Printer::Print(printer,"static const char descriptor[] = {\n");
    io::Printer::Indent(printer);
    if (pairs.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x103e8) {
      if (pairs.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        uVar20 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&pairs);
          CEscape(&local_190,&local_50);
          EscapeTrigraphs(&local_1b0,&local_190);
          io::Printer::Print(printer,"  \"$data$\"\n","data",&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar20 = uVar20 + 0x28;
        } while (uVar20 < pairs.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      iVar13 = 0;
      while (ppVar19 = (pointer)(long)iVar13,
            ppVar19 < pairs.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        local_16c = iVar13 + 0x19;
        iVar15 = 0;
        do {
          if (pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish <= ppVar19) {
            iVar18 = iVar13 - iVar15;
            break;
          }
          std::__cxx11::string::substr((ulong)&local_190,(ulong)&pairs);
          CEscape(&local_1b0,&local_190);
          io::Printer::Print(printer,"\'$char$\', ","char",&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          ppVar19 = (pointer)((long)&ppVar19->first + 1);
          iVar15 = iVar15 + -1;
          iVar18 = local_16c;
        } while (iVar15 != -0x19);
        io::Printer::Print(printer,"\n");
        iVar13 = iVar18;
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n");
    SimpleItoa_abi_cxx11_
              (&local_1b0,
               (protobuf *)
               pairs.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,i_00);
    io::Printer::Print(printer,
                       "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n    descriptor, $size$);\n"
                       ,"size",&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Print(printer,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",*(string **)this->file_);
    if (pairs.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&pairs.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(pairs.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(pairs.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1
                             ));
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&value);
  }
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x18)) {
    iVar13 = 0;
    do {
      pFVar7 = FileDescriptor::dependency(pFVar7,iVar13);
      psVar1 = *(string **)(pFVar7 + 8);
      FileLevelNamespace((string *)&pairs,*(string **)pFVar7);
      QualifiedFileLevelSymbol((string *)&value,psVar1,(string *)&pairs);
      if (pairs.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&pairs.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(pairs.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(pairs.
                                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                               1));
      }
      io::Printer::Print(printer,"$file_namespace$::AddDescriptors();\n","file_namespace",
                         (string *)&value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value != local_118) {
        operator_delete((void *)value,local_118[0]._M_allocated_capacity + 1);
      }
      iVar13 = iVar13 + 1;
      pFVar7 = this->file_;
    } while (iVar13 < *(int *)(pFVar7 + 0x18));
  }
  io::Printer::Print(printer,"::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\nvoid AddDescriptors() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n}\n"
                    );
  bVar23 = StaticInitializersForced(this->file_,&this->options_);
  if (!bVar23) {
    io::Printer::Print(printer,"#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  io::Printer::Print(printer,
                     "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer {\n  StaticDescriptorInitializer() {\n    AddDescriptors();\n  }\n} static_descriptor_initializer;\n"
                    );
  bVar23 = StaticInitializersForced(this->file_,&this->options_);
  if (!bVar23) {
    io::Printer::Print(printer,"#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  if (aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)aux_entries.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)aux_entries.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.

  // TODO(ckennelly): Gate this with the same options flag to enable
  // table-driven parsing.

  printer->Print("PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n"
                 "    const TableStruct::entries[] = {\n");
  printer->Indent();

  std::vector<size_t> entries;
  size_t count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseOffsets(printer);
    entries.push_back(value);
    count += value;
  }

  // We need these arrays to exist, and MSVC does not like empty arrays.
  if (count == 0) {
    printer->Print("{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n"
      "    const TableStruct::aux[] = {\n");
  printer->Indent();

  std::vector<size_t> aux_entries;
  count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
    aux_entries.push_back(value);
    count += value;
  }

  if (count == 0) {
    printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n"
      "    TableStruct::schema[] = {\n");
  printer->Indent();

  size_t offset = 0;
  size_t aux_offset = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
    offset += entries[i];
    aux_offset += aux_entries[i];
  }

  if (message_generators_.empty()) {
    printer->Print("{ NULL, NULL, 0, -1, -1, false },\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  if (HasDescriptorMethods(file_, options_)) {
    if (!message_generators_.empty()) {
      printer->Print("const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      printer->Indent();
      std::vector<std::pair<size_t, size_t> > pairs;
      for (int i = 0; i < message_generators_.size(); i++) {
        pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n"
          "static const ::google::protobuf::internal::MigrationSchema schemas[] = {\n");
      printer->Indent();
      {
        int offset = 0;
        for (int i = 0; i < message_generators_.size(); i++) {
          message_generators_[i]->GenerateSchema(printer, offset,
                                                 pairs[i].second);
          offset += pairs[i].first;
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\nstatic "
          "::google::protobuf::Message const * const file_default_instances[] = {\n");
      printer->Indent();
      for (int i = 0; i < message_generators_.size(); i++) {
        const Descriptor* descriptor = message_generators_[i]->descriptor_;
        printer->Print(
            "reinterpret_cast<const "
            "::google::protobuf::Message*>(&_$classname$_default_instance_),\n",
            "classname", ClassName(descriptor, false));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n");
    } else {
      // we still need these symbols to exist
      printer->Print(
          // MSVC doesn't like empty arrays, so we add a dummy.
          "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\n"
          "static const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\n"
          "static const ::google::protobuf::Message* const* "
          "file_default_instances = NULL;\n");
    }

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    string message_factory = "NULL";
    printer->Print(
        "namespace {\n"
        "\n"
        "void protobuf_AssignDescriptors() {\n"
        // Make sure the file has found its way into the pool.  If a descriptor
        // is requested *during* static init then AddDescriptors() may not have
        // been called yet, so we call it manually.  Note that it's fine if
        // AddDescriptors() is called multiple times.
        "  AddDescriptors();\n"
        "  ::google::protobuf::MessageFactory* factory = $factory$;\n"
        "  AssignDescriptors(\n"
        "      \"$filename$\", schemas, file_default_instances, "
        "TableStruct::offsets, factory,\n"
        "      $metadata$, $enum_descriptors$, $service_descriptors$);\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);
    // TODO(gerbens) have the compiler include the schemas for map types
    // so that this can go away, and we can potentially use table driven
    // serialization for map types as well.
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "file_level_metadata[$index$].reflection = "
          "$parent$::$classname$::CreateReflection(file_level_metadata[$index$]"
          ".descriptor, _$classname$_default_instance_.get_mutable());\n",
          "index", SimpleItoa(i), "parent",
          ClassName(message_generators_[i]->descriptor_->containing_type(),
                    false),
          "classname", ClassName(message_generators_[i]->descriptor_, false));
    }
    printer->Print(
        "}\n"
        "\n"
        "void protobuf_AssignDescriptorsOnce() {\n"
        "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
        "  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n"
        "}\n"
        "\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);

    // Only here because of useless string reference that we don't want in
    // protobuf_AssignDescriptorsOnce, because that is called from all the
    // GetMetadata member methods.
    printer->Print(
        "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\n"
        "void protobuf_RegisterTypes(const ::std::string&) {\n"
        "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    // All normal messages can be done generically
    if (!message_generators_.empty()) {
      printer->Print(
        "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n",
        "size", SimpleItoa(message_generators_.size()));
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void TableStruct::Shutdown() {\n");
  printer->Indent();

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  if (HasDescriptorMethods(file_, options_)) {
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "delete file_level_metadata[$index$].reflection;\n",
          "index", SimpleItoa(i));
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the InitDefaultsImpl() function.
  printer->Print(
      "void TableStruct::InitDefaultsImpl() {\n"
      "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
      // Force initialization of primitive values we depend on.
      "  ::google::protobuf::internal::InitProtobufDefaults();\n");

  printer->Indent();

  // Call the InitDefaults() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::InitDefaults();\n", "file_namespace",
                   file_namespace);
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void InitDefaults() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n"
      "}\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  printer->Print(
      "void AddDescriptorsImpl() {\n"
      "  InitDefaults();\n");

  printer->Indent();
  if (HasDescriptorMethods(file_, options_)) {
    // Embed the descriptor.  We simply serialize the entire
    // FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print("static const char descriptor[] = {\n");
    printer->Indent();

    if (file_data.size() > 66535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds 65535
      // bytes in length". Declare a static array of characters rather than use
      // a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          printer->Print("'$char$', ", "char",
                         CEscape(file_data.substr(i, 1)));
        }
        printer->Print("\n");
      }
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        printer->Print("  \"$data$\"\n", "data",
                       EscapeTrigraphs(CEscape(
                           file_data.substr(i, kBytesPerLine))));
      }
    }

    printer->Outdent();
    printer->Print("};\n");
    printer->Print(
        "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n"
        "    descriptor, $size$);\n",
        "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::AddDescriptors();\n", "file_namespace",
                   file_namespace);
  }

  printer->Print(
      "::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void AddDescriptors() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n"
      "}\n");

  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  printer->Print(
      // With static initializers.
      "// Force AddDescriptors() to be called at static initialization time.\n"
      "struct StaticDescriptorInitializer {\n"
      "  StaticDescriptorInitializer() {\n"
      "    AddDescriptors();\n"
      "  }\n"
      "} static_descriptor_initializer;\n");
  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
}